

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::core::ConfidentialValue::ConfidentialValue(ConfidentialValue *this,string *hex_string)

{
  ByteData *this_00;
  uint8_t uVar1;
  size_t sVar2;
  CfdException *this_01;
  uint8_t *__x;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  this->_vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00276ff0;
  this_00 = &this->data_;
  ByteData::ByteData(this_00,hex_string);
  this->version_ = '\0';
  sVar2 = ByteData::GetDataSize(this_00);
  __x = &this->version_;
  if (sVar2 == 0) goto LAB_001fd566;
  if (sVar2 == 8) {
    bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *__x = '\x01';
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50,this_00);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bytes,__x);
    ::std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (local_50._M_impl.super__Vector_impl_data._M_start,
               local_50._M_impl.super__Vector_impl_data._M_finish,&bytes);
    ByteData::ByteData((ByteData *)&local_38,&bytes);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,&local_38);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
LAB_001fd559:
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
  }
  else {
    if ((sVar2 != 9) && (sVar2 != 0x21)) {
      bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcore_elements_transaction.cpp";
      bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,0x211);
      bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "ConfidentialValue";
      local_50._M_impl.super__Vector_impl_data._M_start = (pointer)ByteData::GetDataSize(this_00);
      logger::warn<unsigned_long>
                ((CfdSourceLocation *)&bytes,"Value size Invalid. size={}.",
                 (unsigned_long *)&local_50);
      this_01 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)&bytes,"Value size Invalid.",(allocator *)&local_50);
      CfdException::CfdException(this_01,kCfdIllegalArgumentError,(string *)&bytes);
      __cxa_throw(this_01,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::GetBytes(&bytes,this_00);
    uVar1 = *bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    *__x = uVar1;
    if (uVar1 == '\0') {
      ByteData::ByteData((ByteData *)&local_50);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,&local_50);
      goto LAB_001fd559;
    }
  }
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
LAB_001fd566:
  CheckVersion(*__x);
  return;
}

Assistant:

ConfidentialValue::ConfidentialValue(const std::string &hex_string)
    : data_(hex_string), version_(0) {
  switch (data_.GetDataSize()) {
    case 0:
      // do nothing
      break;
    case kAssetValueSize: {
      std::vector<uint8_t> bytes;
      version_ = kConfidentialVersion_1;
      const std::vector<uint8_t> &data = data_.GetBytes();
      bytes.push_back(version_);
      std::copy(data.begin(), data.end(), std::back_inserter(bytes));
      data_ = ByteData(bytes);
      break;
    }
    case kConfidentialDataSize:
    case kConfidentialValueSize: {
      const std::vector<uint8_t> &data = data_.GetBytes();
      version_ = data[0];
      if (version_ == 0) {
        data_ = ByteData();
      }
      break;
    }
    default:
      warn(
          CFD_LOG_SOURCE, "Value size Invalid. size={}.", data_.GetDataSize());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Value size Invalid.");
  }
  CheckVersion(version_);
}